

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void __thiscall IDLExport::IDLExport(IDLExport *this)

{
  allocator local_11;
  IDLExport *local_10;
  IDLExport *this_local;
  
  local_10 = this;
  Typelib::Exporter::Exporter(&this->super_Exporter);
  *(undefined ***)this = &PTR_begin_00161798;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_namespace,"/",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::__cxx11::string::string((string *)&this->m_ns_prefix);
  std::__cxx11::string::string((string *)&this->m_ns_suffix);
  std::__cxx11::string::string((string *)&this->m_indent);
  this->m_opaque_as_any = false;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_selected_types);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->m_typedefs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
  ::map(&this->m_exported_typedefs);
  return;
}

Assistant:

IDLExport::IDLExport()
    : m_namespace("/"), m_opaque_as_any(false) {}